

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O0

int fy_fetch_key(fy_parser *fyp,int c)

{
  _Bool _Var1;
  int iVar2;
  fy_atom *pfVar3;
  fy_atom *pfVar4;
  fy_token *pfVar5;
  char *pcVar6;
  fy_atom fStack_118;
  undefined8 uStack_e0;
  undefined1 auStack_d8 [8];
  fy_parser *local_d0;
  fy_parser *local_c8;
  fy_token_list *local_c0;
  undefined1 auStack_b8 [8];
  fy_diag_report_ctx _drc_1;
  undefined1 auStack_88 [8];
  fy_diag_report_ctx _drc;
  fy_token *fyt;
  undefined1 local_48 [7];
  _Bool target_simple_key_allowed;
  fy_simple_key_mark skm;
  fy_mark mark;
  int rc;
  int c_local;
  fy_parser *fyp_local;
  
  if (c == 0x3f) {
    if ((fyp->flow_level == 0) || (fyp->indent < fyp->column)) {
      uStack_e0 = 0x142f42;
      fy_get_simple_key_mark(fyp,(fy_simple_key_mark *)local_48);
      uStack_e0 = 0x142f4f;
      fy_get_mark(fyp,(fy_mark *)&skm.required);
      if ((fyp->flow_level != 0) || ((*(ushort *)&fyp->field_0x70 >> 3 & 1) != 0)) {
        pfVar3 = (fy_atom *)auStack_d8;
        if ((fyp->flow_level == 0) && (pfVar3 = (fy_atom *)auStack_d8, fyp->indent < fyp->column)) {
          uStack_e0 = 0x143033;
          iVar2 = fy_push_indent(fyp,fyp->column,true);
          if (iVar2 != 0) {
            uStack_e0 = 0x143066;
            fy_parser_diag(fyp,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0x79a,"fy_fetch_key","fy_push_indent() failed");
            return iVar2;
          }
          local_c0 = &fyp->queued_tokens;
          pfVar3 = &fStack_118;
          local_c8 = fyp;
          pfVar4 = fy_fill_atom(fyp,0,pfVar3);
          pfVar5 = fy_token_queue_internal(local_c8,local_c0,FYTT_BLOCK_MAPPING_START,pfVar4);
          if (pfVar5 == (fy_token *)0x0) {
            fy_parser_diag(fyp,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0x79f,"fy_fetch_key","fy_token_queue_internal() failed");
            return 0;
          }
        }
        *(undefined8 *)&pfVar3[-1].increment = 0x143105;
        iVar2 = fy_remove_simple_key(fyp,FYTT_KEY);
        if (iVar2 != 0) {
          *(undefined8 *)&pfVar3[-1].increment = 0x143138;
          fy_parser_diag(fyp,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,0x7a4,"fy_fetch_key","fy_remove_simple_key() failed");
          return iVar2;
        }
        iVar2 = fyp->flow_level;
        fyp->pending_complex_key_column = fyp->column;
        *(undefined4 *)&(fyp->pending_complex_key_mark).input_pos = skm._16_4_;
        *(int *)((long)&(fyp->pending_complex_key_mark).input_pos + 4) = skm.flow_level;
        (fyp->pending_complex_key_mark).line = (int)mark.input_pos;
        (fyp->pending_complex_key_mark).column = mark.input_pos._4_4_;
        *(int *)&pfVar3[-1].fyi = fyp->pending_complex_key_column;
        pfVar3[-1].storage_hint = 0x14319b;
        fy_parser_diag(fyp,0x20,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                       ,0x7ab,"fy_fetch_key","pending_complex_key_column %d");
        pfVar3[-2].fyi = (fy_input *)0x1431c1;
        local_d0 = fyp;
        pfVar4 = fy_fill_atom(fyp,1,(fy_atom *)&pfVar3[-2].increment);
        pfVar3[-2].fyi = (fy_input *)0x1431d7;
        pfVar5 = fy_token_queue(local_d0,FYTT_KEY,pfVar4);
        if (pfVar5 == (fy_token *)0x0) {
          pfVar3[-2].fyi = (fy_input *)0x14320c;
          fy_parser_diag(fyp,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,0x7af,"fy_fetch_key","fy_token_queue() failed");
          return 0;
        }
        *(ushort *)&fyp->field_0x70 =
             *(ushort *)&fyp->field_0x70 & 0xfff7 | (ushort)(iVar2 == 0) << 3;
        pcVar6 = "false";
        if ((*(ushort *)&fyp->field_0x70 >> 3 & 1) != 0) {
          pcVar6 = "true";
        }
        pfVar3[-2].storage_hint = (size_t)pcVar6;
        pfVar3[-2].end_mark.line = 0x14328f;
        pfVar3[-2].end_mark.column = 0;
        fy_parser_diag(fyp,0x20,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                       ,0x7b2,"fy_fetch_key","simple_key_allowed -> %s\n");
        while( true ) {
          pfVar3[-2].fyi = (fy_input *)0x14329c;
          iVar2 = fy_parse_peek(fyp);
          pfVar3[-2].fyi = (fy_input *)0x1432a6;
          _Var1 = fy_is_blank(iVar2);
          if (!_Var1) break;
          pfVar3[-2].fyi = (fy_input *)0x1432b8;
          fy_advance(fyp,iVar2);
        }
        if (iVar2 == 0x23) {
          pfVar3[-2].fyi = (fy_input *)0x1432d7;
          iVar2 = fy_scan_comment(fyp,pfVar5->comment + 1,false);
          if (iVar2 != 0) {
            pfVar3[-2].fyi = (fy_input *)0x14330a;
            fy_parser_diag(fyp,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0x7bc,"fy_fetch_key","fy_scan_comment() failed");
            return iVar2;
          }
        }
        return 0;
      }
      _drc_1.fyt = (fy_token *)0x0;
      _drc_1.has_override = false;
      _drc_1._17_7_ = 0;
      _drc_1.type = FYET_DEBUG;
      _drc_1.module = FYEM_UNKNOWN;
      _drc_1.override_file = (char *)0x0;
      auStack_b8._0_4_ = FYET_ERROR;
      auStack_b8._4_4_ = FYEM_SCAN;
      pfVar3 = fy_fill_atom_at(fyp,0,1,&fStack_118);
      _drc_1._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar3);
      fy_parser_diag_report
                (fyp,(fy_diag_report_ctx *)auStack_b8,
                 "invalid mapping key (not allowed in this context)");
    }
    else {
      _drc.fyt = (fy_token *)0x0;
      _drc.has_override = false;
      _drc._17_7_ = 0;
      _drc.type = FYET_DEBUG;
      _drc.module = FYEM_UNKNOWN;
      _drc.override_file = (char *)0x0;
      auStack_88._0_4_ = FYET_ERROR;
      auStack_88._4_4_ = FYEM_SCAN;
      pfVar3 = fy_fill_atom_at(fyp,0,1,&fStack_118);
      _drc._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar3);
      fy_parser_diag_report
                (fyp,(fy_diag_report_ctx *)auStack_88,"wrongly indented mapping key in flow mode");
    }
  }
  else {
    uStack_e0 = 0x142ea2;
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,0x786,"fy_fetch_key","illegal block entry or key mark");
  }
  return -1;
}

Assistant:

int fy_fetch_key(struct fy_parser *fyp, int c) {
    int rc;
    struct fy_mark mark;
    struct fy_simple_key_mark skm;
    bool target_simple_key_allowed;
    struct fy_token *fyt;

    fyp_error_check(fyp, c == '?', err_out,
                    "illegal block entry or key mark");

    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fyp->flow_level || fyp->column > fyp->indent, err_out,
                          "wrongly indented mapping key in flow mode");

    fy_get_simple_key_mark(fyp, &skm);

    /* we have to save the start mark */
    fy_get_mark(fyp, &mark);

    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          fyp->flow_level || fyp->simple_key_allowed, err_out,
                          "invalid mapping key (not allowed in this context)");

    if (!fyp->flow_level && fyp->indent < fyp->column) {

        /* push the new indent level */
        rc = fy_push_indent(fyp, fyp->column, true);
        fyp_error_check(fyp, !rc, err_out_rc,
                        "fy_push_indent() failed");

        fyt = fy_token_queue_internal(fyp, &fyp->queued_tokens,
                                      FYTT_BLOCK_MAPPING_START, fy_fill_atom_a(fyp, 0));
        fyp_error_check(fyp, fyt, err_out_rc,
                        "fy_token_queue_internal() failed");
    }

    rc = fy_remove_simple_key(fyp, FYTT_KEY);
    fyp_error_check(fyp, !rc, err_out_rc,
                    "fy_remove_simple_key() failed");

    target_simple_key_allowed = !fyp->flow_level;

    fyp->pending_complex_key_column = fyp->column;
    fyp->pending_complex_key_mark = mark;
    fyp_scan_debug(fyp, "pending_complex_key_column %d",
                   fyp->pending_complex_key_column);

    fyt = fy_token_queue(fyp, FYTT_KEY, fy_fill_atom_a(fyp, 1));
    fyp_error_check(fyp, fyt, err_out_rc,
                    "fy_token_queue() failed");

    fyp->simple_key_allowed = target_simple_key_allowed;
    fyp_scan_debug(fyp, "simple_key_allowed -> %s\n", fyp->simple_key_allowed ? "true" : "false");

    /* eat whitespace */
    while (fy_is_blank(c = fy_parse_peek(fyp)))
        fy_advance(fyp, c);

    /* comment? */
    if (c == '#') {
        rc = fy_scan_comment(fyp, &fyt->comment[fycp_right], false);
        fyp_error_check(fyp, !rc, err_out_rc,
                        "fy_scan_comment() failed");
    }

    return 0;

    err_out:
    rc = -1;
    err_out_rc:
    return rc;
}